

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

void add_global_code(Grammar *g,char *start,char *end,int line)

{
  Code *pCVar1;
  char *pcVar2;
  int line_local;
  char *end_local;
  char *start_local;
  Grammar *g_local;
  
  if (g->code == (Code *)0x0) {
    pCVar1 = (Code *)malloc(0x40);
    g->code = pCVar1;
  }
  else if ((g->ncode + 1 & 4) == 0) {
    pCVar1 = (Code *)realloc(g->code,(ulong)(g->ncode + 4) << 4);
    g->code = pCVar1;
  }
  pcVar2 = dup_str(start,end);
  g->code[g->ncode].code = pcVar2;
  g->code[g->ncode].line = line;
  g->ncode = g->ncode + 1;
  return;
}

Assistant:

void add_global_code(Grammar *g, char *start, char *end, int line) {
  if (!g->code)
    g->code = MALLOC(sizeof(Code) * 4);
  else if (!((g->ncode + 1) & 4))
    g->code = REALLOC(g->code, sizeof(Code) * (g->ncode + 4));
  g->code[g->ncode].code = dup_str(start, end);
  g->code[g->ncode].line = line;
  g->ncode++;
}